

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

void dbg_msg(char *sys,char *fmt,...)

{
  long lVar1;
  char in_AL;
  tm *__tp;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  DBG_LOGGER *pp_Var3;
  long lVar4;
  long in_FS_OFFSET;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 auStack_1158 [16];
  undefined8 local_1148;
  undefined8 local_1140;
  undefined8 local_1138;
  undefined8 local_1130;
  undefined8 local_1128;
  undefined8 local_1118;
  undefined8 local_1108;
  undefined8 local_10f8;
  undefined8 local_10e8;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  char timestr [80];
  char str [4096];
  va_list args;
  
  str[0x28] = '\0';
  str[0x29] = '\0';
  str[0x2a] = '\0';
  str[0x2b] = '\0';
  str[0x2c] = '\0';
  str[0x2d] = '\0';
  str[0x2e] = '\0';
  str[0x2f] = '\0';
  if (in_AL != '\0') {
    local_1128 = in_XMM0_Qa;
    local_1118 = in_XMM1_Qa;
    local_1108 = in_XMM2_Qa;
    local_10f8 = in_XMM3_Qa;
    local_10e8 = in_XMM4_Qa;
    local_10d8 = in_XMM5_Qa;
    local_10c8 = in_XMM6_Qa;
    local_10b8 = in_XMM7_Qa;
  }
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_1148 = in_RDX;
  local_1140 = in_RCX;
  local_1138 = in_R8;
  local_1130 = in_R9;
  time((time_t *)args);
  str._0_8_ = args[0]._0_8_;
  __tp = localtime((time_t *)str);
  strftime(timestr,0x50,"%Y-%m-%d %H:%M:%S",__tp);
  timestr[0x4f] = '\0';
  str_format(str,0x1000,"[%s][%s]: ",timestr,sys);
  sVar2 = strlen(str);
  args[0].gp_offset = 0x10;
  args[0].fp_offset = 0x30;
  args[0].overflow_arg_area = &stack0x00000008;
  args[0].reg_save_area = auStack_1158;
  __vsnprintf_chk(str + (int)sVar2,0x1000 - (long)(int)sVar2,1,0xffffffffffffffff,fmt,args);
  if (0 < num_loggers) {
    pp_Var3 = loggers;
    lVar4 = 0;
    do {
      (**pp_Var3)(str);
      lVar4 = lVar4 + 1;
      pp_Var3 = pp_Var3 + 1;
    } while (lVar4 < num_loggers);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void dbg_msg(const char *sys, const char *fmt, ...)
{
	va_list args;
	char str[1024*4];
	char *msg;
	int i, len;

	char timestr[80];
	str_timestamp_format(timestr, sizeof(timestr), FORMAT_SPACE);

	str_format(str, sizeof(str), "[%s][%s]: ", timestr, sys);

	len = str_length(str);
	msg = (char *)str + len;

	va_start(args, fmt);
#if defined(CONF_FAMILY_WINDOWS) && !defined(__GNUC__)
	_vsprintf_p(msg, sizeof(str)-len, fmt, args);
#else
	vsnprintf(msg, sizeof(str)-len, fmt, args);
#endif
	va_end(args);

	for(i = 0; i < num_loggers; i++)
		loggers[i](str);
}